

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O3

void __thiscall
HBT_correlation::create_a_2D_array<double>(HBT_correlation *this,double ***arr2D,int nx,int ny)

{
  double **ppdVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(uint)nx * 8;
  if (nx < 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppdVar1 = (double **)operator_new__(uVar3);
  *arr2D = ppdVar1;
  if (0 < nx) {
    uVar3 = (ulong)(uint)ny << 3;
    if (ny < 0) {
      uVar3 = 0xffffffffffffffff;
    }
    uVar4 = 0;
    do {
      pdVar2 = (double *)operator_new__(uVar3);
      (*arr2D)[uVar4] = pdVar2;
      uVar4 = uVar4 + 1;
    } while ((uint)nx != uVar4);
  }
  return;
}

Assistant:

void HBT_correlation::create_a_2D_array(T **&arr2D, int nx, int ny) {
    arr2D = new T *[nx];
    for (int i = 0; i < nx; i++) {
        arr2D[i] = new T[ny];
    }
}